

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubD::ClearEdgeSharpness(ON_SubD *this)

{
  uint uVar1;
  bool bVar2;
  ON_SubDEdge *local_58;
  ON_SubDEdge *e;
  ON_SubDEdgeIterator eit;
  uint sharp_edge_count;
  ON_SubD *this_local;
  
  eit.m_component_ptr.m_ptr._4_4_ = 0;
  EdgeIterator((ON_SubDEdgeIterator *)&e,this);
  local_58 = ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&e);
  while (local_58 != (ON_SubDEdge *)0x0) {
    bVar2 = ON_SubDEdge::ClearSharpnessForExperts(local_58);
    if (bVar2) {
      ON_SubDEdge::ClearSavedSubdivisionPoints(local_58,true);
      eit.m_component_ptr.m_ptr._4_4_ = eit.m_component_ptr.m_ptr._4_4_ + 1;
    }
    local_58 = ON_SubDEdgeIterator::NextEdge((ON_SubDEdgeIterator *)&e);
  }
  if (eit.m_component_ptr.m_ptr._4_4_ != 0) {
    ChangeGeometryContentSerialNumberForExperts(this,true);
  }
  uVar1 = eit.m_component_ptr.m_ptr._4_4_;
  ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e);
  return uVar1;
}

Assistant:

unsigned int ON_SubD::ClearEdgeSharpness()
{
  unsigned int sharp_edge_count = 0;
  ON_SubDEdgeIterator eit = this->EdgeIterator();
  for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
  {
    if (const_cast<ON_SubDEdge*>(e)->ClearSharpnessForExperts())
    {
      e->ClearSavedSubdivisionPoints(true);
      ++sharp_edge_count;
    }
  }
  
  if (sharp_edge_count != 0)
    this->ChangeGeometryContentSerialNumberForExperts(true);

  return sharp_edge_count;
}